

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzelchdiv.cpp
# Opt level: O3

void __thiscall
TPZCompElHDiv<pzshape::TPZShapeLinear>::SetIntegrationRule
          (TPZCompElHDiv<pzshape::TPZShapeLinear> *this,int ord)

{
  TPZManVector<int,_3> order;
  TPZVec<int> local_50;
  int local_30 [4];
  
  TPZVec<int>::TPZVec(&local_50,0);
  local_50._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0181bce8;
  local_50.fNElements = 1;
  local_50.fNAlloc = 0;
  local_50.fStore = local_30;
  local_30[0] = ord;
  TPZInt1d::SetOrder(&(this->super_TPZIntelGen<pzshape::TPZShapeLinear>).fIntRule,&local_50,0);
  if (local_50.fStore != local_30) {
    local_50.fNAlloc = 0;
    local_50._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813ef0;
    if (local_50.fStore != (int *)0x0) {
      operator_delete__(local_50.fStore);
    }
  }
  return;
}

Assistant:

void TPZCompElHDiv<TSHAPE>::SetIntegrationRule(int ord) {
	TPZManVector<int,3> order(TSHAPE::Dimension,ord);
	this->fIntRule.SetOrder(order);
}